

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_archive_extract(mz_zip_archive *zip_archive,char *dir,
                       _func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  char *pcVar1;
  long lVar2;
  char *__src;
  _func_int_char_ptr_void_ptr *p_Var3;
  mz_bool mVar4;
  int iVar5;
  ulong uVar6;
  size_t __n;
  char *pcVar7;
  int *piVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  char *pcVar10;
  ulong uVar11;
  char cVar12;
  size_t len;
  mz_uint file_index;
  long lVar13;
  mz_uint32 local_ad0;
  undefined8 local_ab0;
  char local_aa8 [512];
  undefined1 local_8a8;
  mz_zip_archive_file_stat info;
  char symlink_to [513];
  char local_238 [520];
  
  local_8a8 = 0;
  memset(symlink_to,0,0x201);
  uVar6 = strlen(dir);
  if (0x200 < uVar6 + 1) {
    return -2;
  }
  local_ad0 = 0;
  local_ab0 = on_extract;
  memset(&info,0,0x458);
  strncpy(local_aa8,dir,0x200);
  cVar12 = local_aa8[uVar6 - 1];
  if ((cVar12 != '/') && (cVar12 != '\\')) {
    local_aa8[uVar6] = '/';
    uVar6 = uVar6 + 1;
  }
  __n = 0x200 - uVar6;
  if (0x1ff < __n) {
    __n = 0x200;
  }
  if (zip_archive != (mz_zip_archive *)0x0) {
    local_ad0 = zip_archive->m_total_files;
  }
  __src = info.m_filename;
  file_index = 0;
LAB_0010f566:
  if (file_index != local_ad0) {
    mVar4 = mz_zip_reader_file_stat(zip_archive,file_index,&info);
    if (mVar4 == 0) {
      iVar5 = -3;
    }
    else {
      if (info.m_filename[0] != '\0') {
        pcVar10 = info.m_filename;
        pcVar7 = __src;
        cVar12 = info.m_filename[0];
        while ((pcVar10 = pcVar10 + 1, cVar12 == '/' || (cVar12 == '\\'))) {
          pcVar1 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
          cVar12 = *pcVar1;
        }
        lVar13 = 0;
        len = 0;
        uVar9 = extraout_RDX;
        do {
          if ((cVar12 == '/') || (cVar12 == '\\')) {
            if ((len != 0) &&
               (iVar5 = zip_strchr_match(__src + lVar13,len,(char)uVar9), uVar9 = extraout_RDX_00,
               iVar5 == 0)) {
              lVar2 = len + lVar13;
              lVar13 = lVar13 + len + 1;
              info.m_filename[lVar2] = cVar12;
            }
            len = 0;
          }
          else {
            if (cVar12 == '\0') goto LAB_0010f623;
            __src[len + lVar13] = cVar12;
            len = len + 1;
          }
          cVar12 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while( true );
      }
      iVar5 = -2;
    }
    goto LAB_0010f7e0;
  }
  goto LAB_0010f7bd;
LAB_0010f623:
  iVar5 = zip_strchr_match(__src + lVar13,len,(char)uVar9);
  if (iVar5 != 0) {
    len = 0;
  }
  (__src + lVar13)[len] = '\0';
  strncpy(local_aa8 + uVar6,__src,__n);
  memset(local_238,0,0x201);
  p_Var3 = local_ab0;
  for (uVar11 = 0; (cVar12 = local_aa8[uVar11], cVar12 != '\0' && (uVar11 < 0x200));
      uVar11 = uVar11 + 1) {
    if (((cVar12 == '\\') || (cVar12 == '/')) && (uVar11 != 0)) {
      if (cVar12 == '\\') {
        local_aa8[uVar11] = '/';
      }
      iVar5 = mkdir(local_238,0x1ed);
      if ((iVar5 == -1) && (piVar8 = __errno_location(), *piVar8 != 0x11)) {
        iVar5 = -0x17;
        goto LAB_0010f7e0;
      }
    }
    local_238[uVar11] = local_aa8[uVar11];
  }
  if (((info.m_version_made_by._1_1_ | 0x10) == 0x13) && ((info.m_external_attr & 0x20000000) != 0))
  {
    if ((0x200 < info.m_uncomp_size) ||
       (mVar4 = mz_zip_reader_extract_to_mem_no_alloc
                          (zip_archive,file_index,symlink_to,0x200,0,(void *)0x0,0), mVar4 == 0)) {
      iVar5 = -0x12;
      goto LAB_0010f7e0;
    }
    symlink_to[info.m_uncomp_size] = '\0';
    iVar5 = symlink(symlink_to,local_aa8);
    if (iVar5 != 0) {
      iVar5 = -0x18;
      goto LAB_0010f7e0;
    }
  }
  else {
    mVar4 = mz_zip_reader_is_file_a_directory(zip_archive,file_index);
    if ((mVar4 == 0) &&
       (mVar4 = mz_zip_reader_extract_to_file(zip_archive,file_index,local_aa8,0), mVar4 == 0)) {
      iVar5 = -0x13;
      goto LAB_0010f7e0;
    }
    if ((0xffff < info.m_external_attr) &&
       (iVar5 = chmod(local_aa8,info.m_external_attr >> 0x10), iVar5 < 0)) {
      iVar5 = -0x14;
      goto LAB_0010f7e0;
    }
  }
  if ((p_Var3 != (_func_int_char_ptr_void_ptr *)0x0) &&
     (iVar5 = (*p_Var3)(local_aa8,arg), iVar5 < 0)) {
LAB_0010f7bd:
    iVar5 = 0;
LAB_0010f7e0:
    mVar4 = mz_zip_reader_end(zip_archive);
    if (mVar4 == 0) {
      return -0x19;
    }
    return iVar5;
  }
  file_index = file_index + 1;
  goto LAB_0010f566;
}

Assistant:

static int zip_archive_extract(mz_zip_archive *zip_archive, const char *dir,
                               int (*on_extract)(const char *filename,
                                                 void *arg),
                               void *arg) {
  int err = 0;
  mz_uint i, n;
  char path[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  char symlink_to[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  mz_zip_archive_file_stat info;
  size_t dirlen = 0, filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));

  dirlen = strlen(dir);
  if (dirlen + 1 > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE) {
    return ZIP_EINVENTNAME;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, dir);
#else
  strncpy(path, dir, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  if (filename_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen) {
    filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen;
  }
  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      err = ZIP_ENOENT;
      goto out;
    }

    if (!zip_name_normalize(info.m_filename, info.m_filename,
                            strlen(info.m_filename))) {
      // Cannot normalize file name;
      err = ZIP_EINVENTNAME;
      goto out;
    }

#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], filename_size, info.m_filename, filename_size);
#else
    strncpy(&path[dirlen], info.m_filename, filename_size);
#endif
    err = zip_mkpath(path);
    if (err < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file,
                               // 0x40 is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE ||
          !mz_zip_reader_extract_to_mem_no_alloc(
              zip_archive, i, symlink_to, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, 0,
              NULL, 0)) {
        err = ZIP_EMEMNOALLOC;
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        err = ZIP_ESYMLINK;
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          err = ZIP_ENOFILE;
          goto out;
        }
      }

#if defined(_MSC_VER) || defined(PS4)
      (void)xattr; // unused
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
        if (CHMOD(path, (mode_t)xattr) < 0) {
          err = ZIP_ENOPERM;
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(zip_archive)) {
    // Cannot end zip reader
    err = ZIP_ECLSZIP;
  }
  return err;
}